

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::html_escape<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,mustache *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  undefined8 in_RAX;
  long lVar5;
  undefined8 local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = in_RAX;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar2 = *(long *)(this + 8);
  if (lVar2 != 0) {
    lVar3 = *(long *)this;
    lVar5 = 0;
    do {
      bVar1 = *(byte *)(lVar3 + lVar5);
      uVar4 = local_38._4_4_;
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          local_38 = CONCAT26(local_38._6_2_,0x3b746f757126);
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_38);
        }
        else if (bVar1 == 0x26) {
          local_38 = CONCAT35(local_38._5_3_,0x3b706d6126);
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_38);
        }
        else {
LAB_001daefb:
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01'
                    );
        }
      }
      else if (bVar1 == 0x27) {
        local_38 = CONCAT26(local_38._6_2_,0x3b736f706126);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_38);
      }
      else if (bVar1 == 0x3c) {
        local_38 = CONCAT44(uVar4,0x3b746c26);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_38);
      }
      else {
        if (bVar1 != 0x3e) goto LAB_001daefb;
        local_38 = CONCAT44(uVar4,0x3b746726);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_38);
      }
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type html_escape(const string_type& s) {
    string_type ret;
    ret.reserve(s.size()*2);
    for (const auto ch : s) {
        switch (ch) {
            case '&':
                ret.append({'&','a','m','p',';'});
                break;
            case '<':
                ret.append({'&','l','t',';'});
                break;
            case '>':
                ret.append({'&','g','t',';'});
                break;
            case '\"':
                ret.append({'&','q','u','o','t',';'});
                break;
            case '\'':
                ret.append({'&','a','p','o','s',';'});
                break;
            default:
                ret.append(1, ch);
                break;
        }
    }
    return ret;
}